

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ech_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  SSL *ssl_00;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pointer psVar4;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar5;
  pointer pEVar6;
  ECHConfig *pEVar7;
  uchar *data;
  size_t len;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *config;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__end1;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__begin1;
  Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *__range1;
  CBB retry_configs;
  CBB body;
  SSL *ssl;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  uVar2 = ssl_protocol_version(ssl_00);
  if (((uVar2 < 0x304) || (ssl_00->s3->ech_status == ssl_ech_accepted)) ||
     (bVar1 = std::operator==(&hs->ech_keys,(nullptr_t)0x0), bVar1)) {
    hs_local._7_1_ = true;
  }
  else {
    iVar3 = CBB_add_u16(out,0xfe0d);
    if (((iVar3 == 0) ||
        (iVar3 = CBB_add_u16_length_prefixed(out,(CBB *)((long)&retry_configs.u + 0x18)), iVar3 == 0
        )) || (iVar3 = CBB_add_u16_length_prefixed
                                 ((CBB *)((long)&retry_configs.u + 0x18),(CBB *)&__range1),
              iVar3 == 0)) {
      hs_local._7_1_ = false;
    }
    else {
      psVar4 = std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::operator->(&hs->ech_keys);
      __end1 = Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::begin
                         (&psVar4->configs);
      puVar5 = Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::end
                         (&psVar4->configs);
      for (; __end1 != puVar5; __end1 = __end1 + 1) {
        pEVar6 = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->(__end1)
        ;
        bVar1 = ECHServerConfig::is_retry_config(pEVar6);
        if (bVar1) {
          pEVar6 = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->
                             (__end1);
          pEVar7 = ECHServerConfig::ech_config(pEVar6);
          data = Array<unsigned_char>::data(&pEVar7->raw);
          pEVar6 = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->
                             (__end1);
          pEVar7 = ECHServerConfig::ech_config(pEVar6);
          len = Array<unsigned_char>::size(&pEVar7->raw);
          iVar3 = CBB_add_bytes((CBB *)&__range1,data,len);
          if (iVar3 == 0) {
            return false;
          }
        }
      }
      iVar3 = CBB_flush(out);
      hs_local._7_1_ = iVar3 != 0;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ech_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) < TLS1_3_VERSION ||
      ssl->s3->ech_status == ssl_ech_accepted ||  //
      hs->ech_keys == nullptr) {
    return true;
  }

  // Write the list of retry configs to |out|. Note |SSL_CTX_set1_ech_keys|
  // ensures |ech_keys| contains at least one retry config.
  CBB body, retry_configs;
  if (!CBB_add_u16(out, TLSEXT_TYPE_encrypted_client_hello) ||
      !CBB_add_u16_length_prefixed(out, &body) ||
      !CBB_add_u16_length_prefixed(&body, &retry_configs)) {
    return false;
  }
  for (const auto &config : hs->ech_keys->configs) {
    if (!config->is_retry_config()) {
      continue;
    }
    if (!CBB_add_bytes(&retry_configs, config->ech_config().raw.data(),
                       config->ech_config().raw.size())) {
      return false;
    }
  }
  return CBB_flush(out);
}